

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeGetSpacePreserve(xmlNode *cur)

{
  int iVar1;
  xmlChar *in_RAX;
  xmlChar *space;
  xmlChar *local_38;
  
  if ((cur != (xmlNode *)0x0) && (local_38 = in_RAX, cur->type == XML_ELEMENT_NODE)) {
    do {
      iVar1 = xmlNodeGetAttrValue(cur,"space",(xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                  &local_38);
      if (iVar1 < 0) {
        return -1;
      }
      if (local_38 != (xmlChar *)0x0) {
        iVar1 = xmlStrEqual(local_38,(xmlChar *)"preserve");
        if (iVar1 != 0) {
          (*xmlFree)(local_38);
          return 1;
        }
        iVar1 = xmlStrEqual(local_38,"default");
        (*xmlFree)(local_38);
        if (iVar1 != 0) {
          return 0;
        }
      }
      cur = cur->parent;
    } while (cur != (_xmlNode *)0x0);
  }
  return -1;
}

Assistant:

int
xmlNodeGetSpacePreserve(const xmlNode *cur) {
    xmlChar *space;
        int res;

    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(-1);

    while (cur != NULL) {
	res = xmlNodeGetAttrValue(cur, BAD_CAST "space", XML_XML_NAMESPACE,
                                  &space);
        if (res < 0)
            return(-1);
	if (space != NULL) {
	    if (xmlStrEqual(space, BAD_CAST "preserve")) {
		xmlFree(space);
		return(1);
	    }
	    if (xmlStrEqual(space, BAD_CAST "default")) {
		xmlFree(space);
		return(0);
	    }
	    xmlFree(space);
	}

	cur = cur->parent;
    }

    return(-1);
}